

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructPrim<tinyusdz::PointInstancer>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               PointInstancer *instancer,string *warn,string *err,PrimReconstructOptions *options)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *this;
  _Rb_tree_header *p_Var2;
  pointer pcVar3;
  pointer pPVar4;
  optional<unsigned_int> oVar5;
  optional<unsigned_int> oVar6;
  undefined1 auVar7 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__k;
  size_type sVar8;
  size_type sVar9;
  TimeSamples *pTVar10;
  bool bVar11;
  byte bVar12;
  uint uVar13;
  int iVar14;
  ostream *poVar15;
  long *plVar16;
  undefined8 *puVar17;
  const_iterator cVar18;
  mapped_type *this_00;
  Property *pPVar19;
  char *pcVar20;
  size_type __n;
  bool bVar21;
  char cVar22;
  undefined1 auVar23 [8];
  long lVar24;
  string *__v;
  Property *args_1;
  Property *pPVar25;
  ulong uVar26;
  optional<unsigned_int> oVar27;
  Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_> dst;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string attr_type_name;
  ostringstream ss_e;
  undefined4 in_stack_fffffffffffffb2c;
  undefined1 local_4d0 [8];
  char *local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c0;
  undefined1 local_4a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  undefined1 uStack_478;
  undefined7 uStack_477;
  undefined1 uStack_470;
  undefined1 local_468 [8];
  _Alloc_hider local_460;
  undefined1 auStack_458 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_450;
  size_type local_430;
  undefined8 uStack_428;
  Property *local_420;
  AttrMetas *local_418;
  Property *local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_408;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_400;
  byte local_3d0;
  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> local_3c8;
  string local_3b0;
  string local_390;
  PointInstancer *local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  TimeSamples *local_348;
  string *local_340;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_338;
  string *local_330;
  optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>>
  *local_328;
  string *local_320;
  string *local_318;
  string *local_310;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_308;
  string *local_300;
  optional<tinyusdz::Relationship> *local_2f8;
  string *local_2f0;
  string *local_2e8;
  string *local_2e0;
  optional<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_> local_2d8;
  undefined1 local_2b8 [8];
  undefined1 local_2b0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2a8;
  undefined2 local_298;
  _Alloc_hider local_290;
  pointer pSStack_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280 [3];
  ios_base local_248 [16];
  ios_base local_238 [264];
  undefined8 *local_130 [2];
  undefined8 local_120 [2];
  string local_110 [16];
  undefined1 local_100 [32];
  undefined8 local_e0 [2];
  undefined8 *local_d0 [2];
  undefined8 local_c0 [2];
  string local_b0 [16];
  undefined1 local_a0 [32];
  long local_80 [2];
  string local_70 [16];
  undefined8 local_60 [2];
  _Base_ptr *local_50 [2];
  _Base_ptr local_40 [2];
  
  local_400._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_400._M_t._M_impl.super__Rb_tree_header._M_header;
  local_400._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bVar21 = false;
  local_400._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_400._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar13 = (uint)options->strict_allowedToken_check;
  local_400._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_400._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar11 = anon_unknown_0::ReconstructGPrimProperties
                     (spec,&local_400,properties,&instancer->super_GPrim,warn,err,
                      options->strict_allowedToken_check);
  if (bVar11) {
    pPVar19 = (Property *)(properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    pPVar25 = (Property *)&(properties->_M_t)._M_impl.super__Rb_tree_header;
    bVar21 = true;
    local_410 = pPVar25;
    if (pPVar19 != pPVar25) {
      local_2e0 = (string *)&instancer->protoIndices;
      local_2e8 = (string *)&instancer->ids;
      local_2f0 = (string *)&instancer->positions;
      local_418 = &(instancer->orientations)._metas;
      local_308 = &(instancer->orientations)._paths;
      local_328 = (optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>>
                   *)&(instancer->orientations)._attrib;
      local_300 = (string *)&instancer->scales;
      local_310 = (string *)&instancer->velocities;
      local_318 = (string *)&instancer->accelerations;
      local_320 = (string *)&instancer->angularVelocities;
      local_330 = (string *)&instancer->invisibleIds;
      local_338 = &(instancer->super_GPrim).props;
      local_2f8 = &instancer->prototypes;
      local_370 = instancer;
      do {
        local_408 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &(pPVar19->_attrib)._variability;
        iVar14 = ::std::__cxx11::string::compare((char *)local_408);
        if (iVar14 == 0) {
          local_420 = pPVar19;
          local_2b8 = (undefined1  [8])(local_2b0 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"prototypes","");
          cVar18 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_400,(key_type *)local_2b8);
          if (local_2b8 != (undefined1  [8])(local_2b0 + 8)) {
            operator_delete((void *)local_2b8,(ulong)(aStack_2a8._M_allocated_capacity + 1));
          }
          pPVar19 = local_420;
          if ((_Rb_tree_header *)cVar18._M_node == &local_400._M_t._M_impl.super__Rb_tree_header) {
            if (((undefined1  [16])(local_420->_rel).targetPath._prop_part.field_2 &
                (undefined1  [16])0xfffffffe00000000) != (undefined1  [16])0x200000000) {
              pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_4a8 + 0x10);
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"():",3);
              poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b8,0xf54);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
              local_4a8._0_8_ = pbVar1;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_4a8,"`{}` must be a Relationship","");
              fmt::format<char[11]>
                        ((string *)local_468,(string *)local_4a8,(char (*) [11])"prototypes");
              poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2b8,(char *)local_468,(long)local_460._M_p);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
              if (local_468 != (undefined1  [8])auStack_458) {
                operator_delete((void *)local_468,(ulong)((long)auStack_458 + 1));
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_4a8._0_8_ != pbVar1) {
                operator_delete((void *)local_4a8._0_8_,
                                CONCAT62(local_4a8._18_6_,local_4a8._16_2_) + 1);
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                puVar17 = (undefined8 *)
                          ::std::__cxx11::string::_M_append
                                    (local_4a8,(ulong)(err->_M_dataplus)._M_p);
                pcVar20 = (char *)(puVar17 + 2);
                if ((char *)*puVar17 == pcVar20) {
                  auStack_458 = *(undefined1 (*) [8])pcVar20;
                  bStack_450._M_dataplus._M_p = (pointer)puVar17[3];
                  local_468 = (undefined1  [8])auStack_458;
                }
                else {
                  auStack_458 = *(undefined1 (*) [8])pcVar20;
                  local_468 = (undefined1  [8])*puVar17;
                }
                local_460._M_p = (pointer)puVar17[1];
                *puVar17 = pcVar20;
                puVar17[1] = 0;
                *(undefined1 *)(puVar17 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)local_468);
                if (local_468 != (undefined1  [8])auStack_458) {
                  operator_delete((void *)local_468,(ulong)((long)auStack_458 + 1));
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_4a8._0_8_ == pbVar1) goto LAB_00227dc8;
LAB_00227dbb:
                operator_delete((void *)local_4a8._0_8_,
                                CONCAT62(local_4a8._18_6_,local_4a8._16_2_) + 1);
              }
LAB_00227dc8:
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b8);
              ::std::ios_base::~ios_base(local_248);
              goto LAB_00227de9;
            }
            nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                      (local_2f8,
                       (Relationship *)((long)&(local_420->_rel).targetPath._prop_part.field_2 + 8))
            ;
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_400,local_408);
          }
        }
        else {
          local_50[0] = local_40;
          lVar24 = *(long *)&(pPVar19->_attrib)._variability;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_50,lVar24,
                     (pPVar19->_attrib)._type_name._M_dataplus._M_p + lVar24);
          pPVar25 = (Property *)((long)&(pPVar19->_attrib)._type_name.field_2 + 8);
          local_2b8 = (undefined1  [8])(local_2b0 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"protoIndices","");
          args_1 = (Property *)local_2b8;
          local_420 = pPVar25;
          (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                    ((ParseResult *)local_468,(_anonymous_namespace_ *)&local_400,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_50,(string *)pPVar25,(Property *)local_2b8,local_2e0,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb2c,uVar13));
          if (local_2b8 != (undefined1  [8])(local_2b0 + 8)) {
            operator_delete((void *)local_2b8,(ulong)(aStack_2a8._M_allocated_capacity + 1));
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],(ulong)((long)&local_40[0]->_M_color + 1));
          }
          iVar14 = 0;
          if (((ulong)local_468 & 0xfffffffd) == 0) {
            iVar14 = 3;
            bVar11 = false;
          }
          else {
            bVar11 = true;
            if (local_468._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"():",3);
              poVar15 = (ostream *)::std::ostream::operator<<((Property *)local_2b8,0xf55);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
              local_4d0 = (undefined1  [8])&local_4c0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_4d0,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[13],std::__cxx11::string>
                        ((string *)local_4a8,(fmt *)local_4d0,(string *)"protoIndices",
                         (char (*) [13])&local_460,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1
                        );
              poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2b8,(char *)local_4a8._0_8_,
                                   CONCAT62(local_4a8._10_6_,local_4a8._8_2_));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_4a8._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_4a8 + 0x10)) {
                operator_delete((void *)local_4a8._0_8_,
                                CONCAT62(local_4a8._18_6_,local_4a8._16_2_) + 1);
              }
              if (local_4d0 != (undefined1  [8])&local_4c0) {
                operator_delete((void *)local_4d0,(ulong)(local_4c0._M_allocated_capacity + 1));
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar16 = (long *)::std::__cxx11::string::_M_append
                                            (local_4d0,(ulong)(err->_M_dataplus)._M_p);
                pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (plVar16 + 2);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar16 ==
                    pbVar1) {
                  pcVar3 = (pbVar1->_M_dataplus)._M_p;
                  local_4a8._16_2_ = SUB82(pcVar3,0);
                  local_4a8._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
                  local_4a8._24_2_ = (undefined2)plVar16[3];
                  local_4a8._26_6_ = (undefined6)((ulong)plVar16[3] >> 0x10);
                  local_4a8._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_4a8 + 0x10);
                }
                else {
                  pcVar3 = (pbVar1->_M_dataplus)._M_p;
                  local_4a8._16_2_ = SUB82(pcVar3,0);
                  local_4a8._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
                  local_4a8._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar16
                  ;
                }
                local_4a8._8_2_ = (undefined2)plVar16[1];
                local_4a8._10_6_ = (undefined6)((ulong)plVar16[1] >> 0x10);
                *plVar16 = (long)pbVar1;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)local_4a8);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_4a8._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_4a8 + 0x10)) {
                  operator_delete((void *)local_4a8._0_8_,
                                  CONCAT62(local_4a8._18_6_,local_4a8._16_2_) + 1);
                }
                if (local_4d0 != (undefined1  [8])&local_4c0) {
                  operator_delete((void *)local_4d0,(ulong)(local_4c0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b8);
              ::std::ios_base::~ios_base(local_248);
              iVar14 = 1;
              bVar11 = false;
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460._M_p !=
              &bStack_450) {
            operator_delete(local_460._M_p,(long)bStack_450._M_dataplus._M_p + 1);
          }
          if (bVar11) {
            local_70._0_8_ = local_60;
            lVar24 = *(long *)&(pPVar19->_attrib)._variability;
            ::std::__cxx11::string::_M_construct<char*>
                      (local_70,lVar24,(pPVar19->_attrib)._type_name._M_dataplus._M_p + lVar24);
            local_2b8 = (undefined1  [8])(local_2b0 + 8);
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"ids","");
            pPVar25 = (Property *)local_2b8;
            (anonymous_namespace)::ParseTypedAttribute<std::vector<long,std::allocator<long>>>
                      ((ParseResult *)local_468,(_anonymous_namespace_ *)&local_400,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_70,(string *)local_420,(Property *)local_2b8,local_2e8,
                       (TypedAttribute<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffb2c,uVar13));
            if (local_2b8 != (undefined1  [8])(local_2b0 + 8)) {
              operator_delete((void *)local_2b8,(ulong)(aStack_2a8._M_allocated_capacity + 1));
            }
            if ((undefined8 *)local_70._0_8_ != local_60) {
              operator_delete((void *)local_70._0_8_,local_60[0] + 1);
            }
            iVar14 = 0;
            if (((ulong)local_468 & 0xfffffffd) == 0) {
              iVar14 = 3;
LAB_00225d77:
              bVar11 = false;
            }
            else {
              bVar11 = true;
              if (local_468._0_4_ != Unmatched) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2b8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2b8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2b8,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"():",3);
                poVar15 = (ostream *)::std::ostream::operator<<((Property *)local_2b8,0xf56);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                local_4d0 = (undefined1  [8])&local_4c0;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_4d0,"Parsing attribute `{}` failed. Error: {}","");
                fmt::format<char[4],std::__cxx11::string>
                          ((string *)local_4a8,(fmt *)local_4d0,(string *)"ids",
                           (char (*) [4])&local_460,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pPVar25);
                poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2b8,(char *)local_4a8._0_8_,
                                     CONCAT62(local_4a8._10_6_,local_4a8._8_2_));
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_4a8._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_4a8 + 0x10)) {
                  operator_delete((void *)local_4a8._0_8_,
                                  CONCAT62(local_4a8._18_6_,local_4a8._16_2_) + 1);
                }
                if (local_4d0 != (undefined1  [8])&local_4c0) {
                  operator_delete((void *)local_4d0,(ulong)(local_4c0._M_allocated_capacity + 1));
                }
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar16 = (long *)::std::__cxx11::string::_M_append
                                              (local_4d0,(ulong)(err->_M_dataplus)._M_p);
                  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (plVar16 + 2);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar16
                      == pbVar1) {
                    pcVar3 = (pbVar1->_M_dataplus)._M_p;
                    local_4a8._16_2_ = SUB82(pcVar3,0);
                    local_4a8._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
                    local_4a8._24_2_ = (undefined2)plVar16[3];
                    local_4a8._26_6_ = (undefined6)((ulong)plVar16[3] >> 0x10);
                    local_4a8._0_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_4a8 + 0x10);
                  }
                  else {
                    pcVar3 = (pbVar1->_M_dataplus)._M_p;
                    local_4a8._16_2_ = SUB82(pcVar3,0);
                    local_4a8._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
                    local_4a8._0_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         *plVar16;
                  }
                  local_4a8._8_2_ = (undefined2)plVar16[1];
                  local_4a8._10_6_ = (undefined6)((ulong)plVar16[1] >> 0x10);
                  *plVar16 = (long)pbVar1;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)err,(string *)local_4a8);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_4a8._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_4a8 + 0x10)) {
                    operator_delete((void *)local_4a8._0_8_,
                                    CONCAT62(local_4a8._18_6_,local_4a8._16_2_) + 1);
                  }
                  if (local_4d0 != (undefined1  [8])&local_4c0) {
                    operator_delete((void *)local_4d0,(ulong)(local_4c0._M_allocated_capacity + 1));
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b8);
                ::std::ios_base::~ios_base(local_248);
                iVar14 = 1;
                goto LAB_00225d77;
              }
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460._M_p
                != &bStack_450) {
              operator_delete(local_460._M_p,(long)bStack_450._M_dataplus._M_p + 1);
            }
            if (bVar11) {
              local_a0._16_8_ = local_80;
              lVar24 = *(long *)&(pPVar19->_attrib)._variability;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)(local_a0 + 0x10),lVar24,
                         (pPVar19->_attrib)._type_name._M_dataplus._M_p + lVar24);
              local_2b8 = (undefined1  [8])(local_2b0 + 8);
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"positions","");
              pPVar25 = (Property *)local_2b8;
              (anonymous_namespace)::
              ParseTypedAttribute<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                        ((ParseResult *)local_468,(_anonymous_namespace_ *)&local_400,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(local_a0 + 0x10),(string *)local_420,(Property *)local_2b8,local_2f0,
                         (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffb2c,uVar13));
              if (local_2b8 != (undefined1  [8])(local_2b0 + 8)) {
                operator_delete((void *)local_2b8,(ulong)(aStack_2a8._M_allocated_capacity + 1));
              }
              if ((long *)local_a0._16_8_ != local_80) {
                operator_delete((void *)local_a0._16_8_,local_80[0] + 1);
              }
              iVar14 = 0;
              if (((ulong)local_468 & 0xfffffffd) == 0) {
                iVar14 = 3;
LAB_00226075:
                bVar11 = false;
              }
              else {
                bVar11 = true;
                if (local_468._0_4_ != Unmatched) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2b8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2b8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2b8,"ReconstructPrim",0xf);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"():",3)
                  ;
                  poVar15 = (ostream *)::std::ostream::operator<<((Property *)local_2b8,0xf57);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                  local_4d0 = (undefined1  [8])&local_4c0;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_4d0,"Parsing attribute `{}` failed. Error: {}","");
                  fmt::format<char[10],std::__cxx11::string>
                            ((string *)local_4a8,(fmt *)local_4d0,(string *)"positions",
                             (char (*) [10])&local_460,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pPVar25);
                  poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2b8,(char *)local_4a8._0_8_,
                                       CONCAT62(local_4a8._10_6_,local_4a8._8_2_));
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_4a8._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_4a8 + 0x10)) {
                    operator_delete((void *)local_4a8._0_8_,
                                    CONCAT62(local_4a8._18_6_,local_4a8._16_2_) + 1);
                  }
                  if (local_4d0 != (undefined1  [8])&local_4c0) {
                    operator_delete((void *)local_4d0,(ulong)(local_4c0._M_allocated_capacity + 1));
                  }
                  if (err != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar16 = (long *)::std::__cxx11::string::_M_append
                                                (local_4d0,(ulong)(err->_M_dataplus)._M_p);
                    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (plVar16 + 2);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        *plVar16 == pbVar1) {
                      pcVar3 = (pbVar1->_M_dataplus)._M_p;
                      local_4a8._16_2_ = SUB82(pcVar3,0);
                      local_4a8._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
                      local_4a8._24_2_ = (undefined2)plVar16[3];
                      local_4a8._26_6_ = (undefined6)((ulong)plVar16[3] >> 0x10);
                      local_4a8._0_8_ =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_4a8 + 0x10);
                    }
                    else {
                      pcVar3 = (pbVar1->_M_dataplus)._M_p;
                      local_4a8._16_2_ = SUB82(pcVar3,0);
                      local_4a8._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
                      local_4a8._0_8_ =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           *plVar16;
                    }
                    local_4a8._8_2_ = (undefined2)plVar16[1];
                    local_4a8._10_6_ = (undefined6)((ulong)plVar16[1] >> 0x10);
                    *plVar16 = (long)pbVar1;
                    plVar16[1] = 0;
                    *(undefined1 *)(plVar16 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)err,(string *)local_4a8);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_4a8._0_8_ !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_4a8 + 0x10)) {
                      operator_delete((void *)local_4a8._0_8_,
                                      CONCAT62(local_4a8._18_6_,local_4a8._16_2_) + 1);
                    }
                    if (local_4d0 != (undefined1  [8])&local_4c0) {
                      operator_delete((void *)local_4d0,(ulong)(local_4c0._M_allocated_capacity + 1)
                                     );
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b8);
                  ::std::ios_base::~ios_base(local_248);
                  iVar14 = 1;
                  goto LAB_00226075;
                }
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_460._M_p != &bStack_450) {
                operator_delete(local_460._M_p,(long)bStack_450._M_dataplus._M_p + 1);
              }
              if (bVar11) {
                local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
                lVar24 = *(long *)&(pPVar19->_attrib)._variability;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_368,lVar24,
                           (pPVar19->_attrib)._type_name._M_dataplus._M_p + lVar24);
                local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_3b0,"orientations","");
                sVar9 = local_368._M_string_length;
                sVar8 = local_3b0._M_string_length;
                local_4c8 = local_4c0._M_local_buf + 8;
                local_4c0._M_allocated_capacity = 0;
                local_4c0._M_local_buf[8] = '\0';
                __n = local_368._M_string_length;
                if (local_3b0._M_string_length < local_368._M_string_length) {
                  __n = local_3b0._M_string_length;
                }
                if (__n == 0) {
                  if (local_368._M_string_length == local_3b0._M_string_length) goto LAB_00226157;
LAB_0022631a:
                  local_4d0._0_4_ = 1;
                }
                else {
                  iVar14 = bcmp(local_368._M_dataplus._M_p,local_3b0._M_dataplus._M_p,__n);
                  if ((sVar9 != sVar8) || (iVar14 != 0)) goto LAB_0022631a;
LAB_00226157:
                  if (((undefined1  [16])(pPVar19->_rel).targetPath._prop_part.field_2 &
                      (undefined1  [16])0xfffffffe00000000) == (undefined1  [16])0x200000000) {
                    local_4d0._0_4_ = 7;
                    local_4a8._0_8_ = &DAT_0000003e;
                    local_468 = (undefined1  [8])auStack_458;
                    local_468 = (undefined1  [8])
                                ::std::__cxx11::string::_M_create
                                          ((ulong *)local_468,(ulong)local_4a8);
                    auStack_458 = (undefined1  [8])local_4a8._0_8_;
                    builtin_strncpy((char *)local_468,
                                    "Property `{}` must be Attribute, but declared as Relationship."
                                    ,0x3e);
                    local_460._M_p = (pointer)local_4a8._0_8_;
                    *(char *)((long)local_468 + local_4a8._0_8_) = '\0';
                    fmt::format<std::__cxx11::string>
                              ((string *)local_2b8,(fmt *)local_468,&local_3b0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_4a8._0_8_);
                    ::std::__cxx11::string::operator=((string *)&local_4c8,(string *)local_2b8);
                    if (local_2b8 != (undefined1  [8])(local_2b0 + 8)) {
                      operator_delete((void *)local_2b8,
                                      (ulong)(aStack_2a8._M_allocated_capacity + 1));
                    }
                    if (local_468 != (undefined1  [8])auStack_458) {
                      operator_delete((void *)local_468,(ulong)((long)auStack_458 + 1));
                    }
                  }
                  if (*(long *)((long)&(pPVar19->_attrib)._metas.comment.contained + 0x10) !=
                      *(long *)((long)&(pPVar19->_attrib)._metas.comment.contained + 8)) {
                    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_308,
                               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                               ((long)&(pPVar19->_attrib)._metas.comment.contained + 8));
                    local_4d0 = (undefined1  [8])((ulong)local_4d0 & 0xffffffff00000000);
                  }
                  Attribute::type_name_abi_cxx11_(&local_390,&local_420->_attrib);
                  tinyusdz::value::
                  TypeTraits<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                  ::type_name_abi_cxx11_();
                  auVar23 = local_2b8;
                  if ((local_2b0 != (undefined1  [8])local_390._M_string_length) ||
                     ((bVar11 = true, local_2b0 != (undefined1  [8])0x0 &&
                      (iVar14 = bcmp((void *)local_2b8,local_390._M_dataplus._M_p,(size_t)local_2b0)
                      , iVar14 != 0)))) {
                    tinyusdz::value::
                    TypeTraits<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                    ::underlying_type_name_abi_cxx11_();
                    auVar7 = local_468;
                    if (local_460._M_p == (pointer)local_390._M_string_length) {
                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_460._M_p ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        bVar11 = true;
                      }
                      else {
                        iVar14 = bcmp((void *)local_468,local_390._M_dataplus._M_p,
                                      (size_t)local_460._M_p);
                        bVar11 = iVar14 == 0;
                      }
                    }
                    else {
                      bVar11 = false;
                    }
                    auVar23 = local_2b8;
                    if (auVar7 != (undefined1  [8])auStack_458) {
                      operator_delete((void *)auVar7,(ulong)((long)auStack_458 + 1));
                      auVar23 = local_2b8;
                    }
                  }
                  if (auVar23 != (undefined1  [8])(local_2b0 + 8)) {
                    operator_delete((void *)auVar23,(ulong)(aStack_2a8._M_allocated_capacity + 1));
                  }
                  if (bVar11) {
                    iVar14 = *(int *)((long)&(pPVar19->_rel).targetPath._prop_part.field_2 + 4);
                    if (iVar14 == 1) {
                      oVar27.has_value_ = (pPVar19->_attrib)._metas.hidden.has_value_;
                      oVar27._1_1_ = (pPVar19->_attrib)._metas.hidden.contained;
                      oVar27._2_2_ = *(undefined2 *)&(pPVar19->_attrib)._metas.field_0x12;
                      oVar27.contained =
                           *(storage_t<unsigned_int> *)&(pPVar19->_attrib)._metas.field_0x14;
                      if (oVar27 == (pPVar19->_attrib)._metas.elementSize) {
                        pPVar4 = (pPVar19->_attrib)._paths.
                                 super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                        if (pPVar4 == (pointer)0x0) {
                          bVar11 = false;
                        }
                        else {
                          iVar14 = (*(code *)(pPVar4->_prim_part)._M_dataplus._M_p)();
                          bVar11 = iVar14 == 4;
                        }
                        bVar12 = (pPVar19->_attrib)._metas.interpolation.has_value_;
                        if ((bVar11) || ((bVar12 & 1) != 0)) {
                          (local_370->orientations)._blocked = true;
                        }
                      }
                      else {
                        bVar12 = (pPVar19->_attrib)._metas.interpolation.has_value_;
                      }
                      if (((((bVar12 & 1) == 0) &&
                           (pPVar4 = (pPVar19->_attrib)._paths.
                                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           pPVar4 != (pointer)0x0)) &&
                          ((iVar14 = (*(code *)(pPVar4->_prim_part)._M_dataplus._M_p)(), iVar14 == 0
                           || ((pPVar4 = (pPVar19->_attrib)._paths.
                                         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               pPVar4 != (pointer)0x0 &&
                               (iVar14 = (*(code *)(pPVar4->_prim_part)._M_dataplus._M_p)(),
                               iVar14 == 1)))))) &&
                         (oVar5.has_value_ = (pPVar19->_attrib)._metas.hidden.has_value_,
                         oVar5._1_1_ = (pPVar19->_attrib)._metas.hidden.contained,
                         oVar5._2_2_ = *(undefined2 *)&(pPVar19->_attrib)._metas.field_0x12,
                         oVar5.contained =
                              *(storage_t<unsigned_int> *)&(pPVar19->_attrib)._metas.field_0x14,
                         oVar5 == (pPVar19->_attrib)._metas.elementSize)) {
                        if (*(long *)((long)&(pPVar19->_attrib)._metas.comment.contained + 0x10) ==
                            *(long *)((long)&(pPVar19->_attrib)._metas.comment.contained + 8))
                        goto LAB_00226a05;
                        AttrMetas::operator=
                                  (local_418,
                                   (AttrMetas *)
                                   ((long)&(pPVar19->_attrib)._metas.comment.contained + 0x20));
                        __v = (string *)&local_368;
                        goto LAB_002269f8;
                      }
                      this = &(pPVar19->_attrib)._paths;
                      uStack_478 = 0;
                      uStack_477 = 0;
                      uStack_470 = 0;
                      local_488._M_allocated_capacity = 0;
                      local_488._M_local_buf[8] = '\0';
                      local_488._9_7_ = 0;
                      local_4a8._16_2_ = 0;
                      local_4a8._18_6_ = 0;
                      local_4a8._24_2_ = 0;
                      local_4a8._0_8_ =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                      local_4a8._8_2_ = 0;
                      local_4a8._10_6_ = 0;
                      bVar11 = primvar::PrimVar::is_valid((PrimVar *)this);
                      if (bVar11) {
                        if ((((pPVar19->_attrib)._metas.interpolation.has_value_ == false) &&
                            (pPVar4 = (pPVar19->_attrib)._paths.
                                      super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            pPVar4 != (pointer)0x0)) &&
                           ((iVar14 = (*(code *)(pPVar4->_prim_part)._M_dataplus._M_p)(),
                            iVar14 == 0 ||
                            ((pPVar4 = (pPVar19->_attrib)._paths.
                                       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             pPVar4 != (pointer)0x0 &&
                             (iVar14 = (*(code *)(pPVar4->_prim_part)._M_dataplus._M_p)(),
                             iVar14 == 1)))))) {
                          bVar12 = 0;
                        }
                        else {
                          primvar::PrimVar::
                          get_value<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                                    (&local_2d8,(PrimVar *)this);
                          bVar12 = local_2d8.has_value_;
                          local_3d0 = local_2d8.has_value_;
                          if (local_2d8.has_value_ != false) {
                            local_3c8.
                            super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)local_2d8.contained.data._0_8_;
                            local_3c8.
                            super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                            ._M_impl.super__Vector_impl_data._M_finish =
                                 (pointer)local_2d8.contained._8_8_;
                            local_3c8.
                            super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                 (pointer)local_2d8.contained._16_8_;
                            ::std::
                            vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                            ::operator=((vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                         *)local_4a8,&local_3c8);
                            local_4a8._24_2_ = 1;
                          }
                          if (((local_3d0 & 1) != 0) &&
                             ((anon_struct_8_0_00000001_for___align)
                              local_3c8.
                              super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                              ._M_impl.super__Vector_impl_data._M_start !=
                              (anon_struct_8_0_00000001_for___align)0x0)) {
                            operator_delete(local_3c8.
                                            super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_3c8.
                                                  super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_3c8.
                                                                                                        
                                                  super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                        }
                        oVar27 = (pPVar19->_attrib)._metas.elementSize;
                        oVar6.has_value_ = (pPVar19->_attrib)._metas.hidden.has_value_;
                        oVar6._1_1_ = (pPVar19->_attrib)._metas.hidden.contained;
                        oVar6._2_2_ = *(undefined2 *)&(pPVar19->_attrib)._metas.field_0x12;
                        oVar6.contained =
                             *(storage_t<unsigned_int> *)&(pPVar19->_attrib)._metas.field_0x14;
                        if (oVar6 == oVar27) {
                          if (bVar12 == 0) {
                            local_430 = 0;
                            uStack_428 = 0;
                            bStack_450.field_2._M_allocated_capacity = 0;
                            bStack_450.field_2._8_8_ = 0;
                            bStack_450._M_dataplus._M_p = (pointer)0x0;
                            bStack_450._M_string_length = 0;
                            local_460._M_p = (pointer)0x0;
                            auStack_458 = (undefined1  [8])0x0;
LAB_002268c2:
                            local_468 = (undefined1  [8])((ulong)local_468 & 0xffffffffffffff00);
                            cVar22 = '\0';
                            goto LAB_002268d3;
                          }
                        }
                        else {
                          local_348 = (TimeSamples *)&(pPVar19->_attrib)._metas.elementSize;
                          lVar24 = 0;
                          uVar26 = 0;
                          local_340 = err;
                          do {
                            pTVar10 = local_348;
                            if (*(char *)&(pPVar19->_attrib)._metas.comment.contained == '\x01') {
                              tinyusdz::value::TimeSamples::update(local_348);
                              oVar27 = (optional<unsigned_int>)
                                       (pTVar10->_samples).
                                       super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                            }
                            if (*(char *)((long)oVar27 + 0x20 + lVar24) == '\x01') {
                              TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                              ::add_blocked_sample
                                        ((TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                                          *)&local_488,*(double *)((long)oVar27 + lVar24));
                            }
                            else {
                              tinyusdz::value::Value::
                              get_value<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                                        (&local_2d8,(Value *)((long)oVar27 + lVar24 + 8),false);
                              bVar11 = local_2d8.has_value_;
                              local_3d0 = local_2d8.has_value_;
                              if (local_2d8.has_value_ == true) {
                                local_3c8.
                                super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                ._M_impl.super__Vector_impl_data._M_start =
                                     (pointer)local_2d8.contained.data._0_8_;
                                local_3c8.
                                super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                ._M_impl.super__Vector_impl_data._M_finish =
                                     (pointer)local_2d8.contained._8_8_;
                                local_3c8.
                                super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                     (pointer)local_2d8.contained._16_8_;
                                TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                                ::add_sample((TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                                              *)&local_488,*(double *)((long)oVar27 + lVar24),
                                             &local_3c8);
                              }
                              else {
                                local_430 = 0;
                                uStack_428 = 0;
                                bStack_450.field_2._M_allocated_capacity = 0;
                                bStack_450.field_2._8_8_ = 0;
                                bStack_450._M_dataplus._M_p = (pointer)0x0;
                                bStack_450._M_string_length = 0;
                                local_460._M_p = (pointer)0x0;
                                auStack_458 = (undefined1  [8])0x0;
                              }
                              if (((local_3d0 & 1) != 0) &&
                                 ((anon_struct_8_0_00000001_for___align)
                                  local_3c8.
                                  super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                  ._M_impl.super__Vector_impl_data._M_start !=
                                  (anon_struct_8_0_00000001_for___align)0x0)) {
                                operator_delete(local_3c8.
                                                super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (long)local_3c8.
                                                                                                            
                                                  super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                - (long)local_3c8.
                                                                                                                
                                                  super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                              }
                              err = local_340;
                              if (bVar11 == false) goto LAB_002268c2;
                            }
                            uVar26 = uVar26 + 1;
                            oVar27 = (pPVar19->_attrib)._metas.elementSize;
                            lVar24 = lVar24 + 0x28;
                          } while (uVar26 < (ulong)((*(long *)&(pPVar19->_attrib)._metas.hidden -
                                                     (long)oVar27 >> 3) * -0x3333333333333333));
                        }
                        local_468[0] = 1;
                        auStack_458 = (undefined1  [8])CONCAT62(local_4a8._10_6_,local_4a8._8_2_);
                        local_460._M_p = (pointer)local_4a8._0_8_;
                        bStack_450._M_dataplus._M_p =
                             (pointer)CONCAT62(local_4a8._18_6_,local_4a8._16_2_);
                        local_4a8._0_8_ =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                        local_4a8._8_2_ = 0;
                        local_4a8._10_6_ = 0;
                        local_4a8._16_2_ = 0;
                        local_4a8._18_6_ = 0;
                        bStack_450._M_string_length =
                             CONCAT62(bStack_450._M_string_length._2_6_,local_4a8._24_2_);
                        bStack_450.field_2._8_8_ =
                             CONCAT71(local_488._9_7_,local_488._M_local_buf[8]);
                        bStack_450.field_2._M_allocated_capacity = local_488._M_allocated_capacity;
                        local_430 = CONCAT71(uStack_477,uStack_478);
                        uStack_478 = 0;
                        uStack_477 = 0;
                        local_488._M_allocated_capacity = 0;
                        local_488._M_local_buf[8] = '\0';
                        local_488._9_7_ = 0;
                        uStack_428 = CONCAT71(uStack_428._1_7_,uStack_470);
                        cVar22 = '\x01';
                      }
                      else {
                        local_468 = (undefined1  [8])((ulong)local_468 & 0xffffffffffffff00);
                        local_430 = 0;
                        uStack_428 = 0;
                        bStack_450.field_2._M_allocated_capacity = 0;
                        bStack_450.field_2._8_8_ = 0;
                        bStack_450._M_dataplus._M_p = (pointer)0x0;
                        bStack_450._M_string_length = 0;
                        local_460._M_p = (pointer)0x0;
                        auStack_458 = (undefined1  [8])0x0;
                        cVar22 = '\0';
                      }
LAB_002268d3:
                      ::std::
                      vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>::Sample>_>
                      ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>::Sample>_>
                                 *)&local_488);
                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_4a8._0_8_ !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        operator_delete((void *)local_4a8._0_8_,
                                        CONCAT62(local_4a8._18_6_,local_4a8._16_2_) -
                                        local_4a8._0_8_);
                      }
                      local_2b8[0] = (ostringstream)cVar22;
                      if (cVar22 == '\0') {
                        local_4d0._0_4_ = 8;
                        pPVar25 = (Property *)0x55;
                        ::std::__cxx11::string::_M_replace
                                  ((ulong)&local_4c8,0,(char *)local_4c0._M_allocated_capacity,
                                   0x3df346);
                      }
                      else {
                        local_2b0 = (undefined1  [8])local_460._M_p;
                        aStack_2a8._M_allocated_capacity = (size_type)auStack_458;
                        aStack_2a8._8_8_ = bStack_450._M_dataplus._M_p;
                        bStack_450._M_dataplus._M_p = (pointer)0x0;
                        local_460._M_p = (pointer)0x0;
                        auStack_458 = (undefined1  [8])0x0;
                        local_298 = (undefined2)bStack_450._M_string_length;
                        local_290._M_p = (pointer)bStack_450.field_2._M_allocated_capacity;
                        pSStack_288 = (pointer)bStack_450.field_2._8_8_;
                        local_280[0]._M_allocated_capacity = local_430;
                        local_430 = 0;
                        bStack_450.field_2._M_allocated_capacity = 0;
                        bStack_450.field_2._8_8_ = 0;
                        local_280[0]._M_local_buf[8] = (char)uStack_428;
                        nonstd::optional_lite::detail::
                        storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>_>
                        ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>_>
                                          *)&local_460);
                        nonstd::optional_lite::
                        optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>>
                        ::operator=(local_328,
                                    (Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                                     *)local_2b0);
                      }
                      if (local_2b8[0] == (ostringstream)0x1) {
                        nonstd::optional_lite::detail::
                        storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>_>
                        ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>_>
                                          *)local_2b0);
                      }
                      if (cVar22 != '\0') goto LAB_002269d9;
                    }
                    else if (iVar14 == 0) {
                      (local_370->orientations)._value_empty = true;
LAB_002269d9:
                      AttrMetas::operator=
                                (local_418,
                                 (AttrMetas *)
                                 ((long)&(pPVar19->_attrib)._metas.comment.contained + 0x20));
                      __v = &local_3b0;
LAB_002269f8:
                      ::std::
                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      ::_M_insert_unique<std::__cxx11::string_const&>
                                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                  *)&local_400,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__v);
                      local_4d0 = (undefined1  [8])((ulong)local_4d0 & 0xffffffff00000000);
                    }
                    else {
                      pPVar25 = (Property *)0x25;
                      ::std::__cxx11::string::_M_replace
                                ((ulong)&local_4c8,0,(char *)local_4c0._M_allocated_capacity,
                                 0x3df078);
                      local_4d0._0_4_ = 8;
                    }
                  }
                  else {
                    local_4d0._0_4_ = 3;
                    ::std::__cxx11::stringstream::stringstream((stringstream *)local_2b8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_2b0 + 8),"Property type mismatch. ",0x18);
                    poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)(local_2b0 + 8),local_3b0._M_dataplus._M_p,
                                         local_3b0._M_string_length);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15," expects type `",0xf);
                    tinyusdz::value::
                    TypeTraits<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                    ::type_name_abi_cxx11_();
                    poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar15,(char *)local_468,(long)local_460._M_p);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,"` but defined as type `",0x17);
                    poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar15,local_390._M_dataplus._M_p,
                                         local_390._M_string_length);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"`",1);
                    if (local_468 != (undefined1  [8])auStack_458) {
                      operator_delete((void *)local_468,(ulong)((long)auStack_458 + 1));
                    }
                    ::std::__cxx11::stringbuf::str();
                    ::std::__cxx11::string::operator=((string *)&local_4c8,(string *)local_468);
                    if (local_468 != (undefined1  [8])auStack_458) {
                      operator_delete((void *)local_468,(ulong)((long)auStack_458 + 1));
                    }
                    ::std::__cxx11::stringstream::~stringstream((stringstream *)local_2b8);
                    ::std::ios_base::~ios_base(local_238);
                  }
LAB_00226a05:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_390._M_dataplus._M_p != &local_390.field_2) {
                    operator_delete(local_390._M_dataplus._M_p,
                                    local_390.field_2._M_allocated_capacity + 1);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                  operator_delete(local_3b0._M_dataplus._M_p,
                                  local_3b0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_368._M_dataplus._M_p != &local_368.field_2) {
                  operator_delete(local_368._M_dataplus._M_p,
                                  local_368.field_2._M_allocated_capacity + 1);
                }
                iVar14 = 0;
                if (((ulong)local_4d0 & 0xfffffffd) == 0) {
                  iVar14 = 3;
LAB_00226c97:
                  bVar11 = false;
                }
                else {
                  bVar11 = true;
                  if (local_4d0._0_4_ != 1) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b8,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b8,"():",3);
                    poVar15 = (ostream *)::std::ostream::operator<<((Property *)local_2b8,0xf58);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_4a8 + 0x10);
                    local_4a8._0_8_ = pbVar1;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_4a8,"Parsing attribute `{}` failed. Error: {}","");
                    fmt::format<char[13],std::__cxx11::string>
                              ((string *)local_468,(fmt *)local_4a8,(string *)"orientations",
                               (char (*) [13])&local_4c8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pPVar25);
                    poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2b8,(char *)local_468,(long)local_460._M_p
                                        );
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
                    if (local_468 != (undefined1  [8])auStack_458) {
                      operator_delete((void *)local_468,(ulong)((long)auStack_458 + 1));
                    }
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_4a8._0_8_ != pbVar1) {
                      operator_delete((void *)local_4a8._0_8_,
                                      CONCAT62(local_4a8._18_6_,local_4a8._16_2_) + 1);
                    }
                    if (err != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x0) {
                      ::std::__cxx11::stringbuf::str();
                      puVar17 = (undefined8 *)
                                ::std::__cxx11::string::_M_append
                                          (local_4a8,(ulong)(err->_M_dataplus)._M_p);
                      pcVar20 = (char *)(puVar17 + 2);
                      if ((char *)*puVar17 == pcVar20) {
                        auStack_458 = *(undefined1 (*) [8])pcVar20;
                        bStack_450._M_dataplus._M_p = (pointer)puVar17[3];
                        local_468 = (undefined1  [8])auStack_458;
                      }
                      else {
                        auStack_458 = *(undefined1 (*) [8])pcVar20;
                        local_468 = (undefined1  [8])*puVar17;
                      }
                      local_460._M_p = (pointer)puVar17[1];
                      *puVar17 = pcVar20;
                      puVar17[1] = 0;
                      *(undefined1 *)(puVar17 + 2) = 0;
                      ::std::__cxx11::string::operator=((string *)err,(string *)local_468);
                      if (local_468 != (undefined1  [8])auStack_458) {
                        operator_delete((void *)local_468,(ulong)((long)auStack_458 + 1));
                      }
                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_4a8._0_8_ != pbVar1) {
                        operator_delete((void *)local_4a8._0_8_,
                                        CONCAT62(local_4a8._18_6_,local_4a8._16_2_) + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b8);
                    ::std::ios_base::~ios_base(local_248);
                    iVar14 = 1;
                    goto LAB_00226c97;
                  }
                }
                if (local_4c8 != local_4c0._M_local_buf + 8) {
                  operator_delete(local_4c8,CONCAT71(local_4c0._9_7_,local_4c0._M_local_buf[8]) + 1)
                  ;
                }
                if (bVar11) {
                  local_b0._0_8_ = local_a0;
                  lVar24 = *(long *)&(pPVar19->_attrib)._variability;
                  ::std::__cxx11::string::_M_construct<char*>
                            (local_b0,lVar24,(pPVar19->_attrib)._type_name._M_dataplus._M_p + lVar24
                            );
                  local_2b8 = (undefined1  [8])(local_2b0 + 8);
                  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"scales","")
                  ;
                  pPVar25 = (Property *)local_2b8;
                  (anonymous_namespace)::
                  ParseTypedAttribute<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                            ((ParseResult *)local_468,(_anonymous_namespace_ *)&local_400,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_b0,(string *)local_420,(Property *)local_2b8,local_300,
                             (TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffffb2c,uVar13));
                  if (local_2b8 != (undefined1  [8])(local_2b0 + 8)) {
                    operator_delete((void *)local_2b8,(ulong)(aStack_2a8._M_allocated_capacity + 1))
                    ;
                  }
                  if ((undefined1 *)local_b0._0_8_ != local_a0) {
                    operator_delete((void *)local_b0._0_8_,local_a0._0_8_ + 1);
                  }
                  iVar14 = 0;
                  if (((ulong)local_468 & 0xfffffffd) == 0) {
                    iVar14 = 3;
LAB_00226f8f:
                    bVar11 = false;
                  }
                  else {
                    bVar11 = true;
                    if (local_468._0_4_ != Unmatched) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b8,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b8,"ReconstructPrim",0xf);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b8,"():",3);
                      poVar15 = (ostream *)::std::ostream::operator<<((Property *)local_2b8,0xf59);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                      local_4d0 = (undefined1  [8])&local_4c0;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_4d0,"Parsing attribute `{}` failed. Error: {}","");
                      fmt::format<char[7],std::__cxx11::string>
                                ((string *)local_4a8,(fmt *)local_4d0,(string *)"scales",
                                 (char (*) [7])&local_460,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pPVar25);
                      poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_2b8,(char *)local_4a8._0_8_,
                                           CONCAT62(local_4a8._10_6_,local_4a8._8_2_));
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_4a8._0_8_ !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_4a8 + 0x10)) {
                        operator_delete((void *)local_4a8._0_8_,
                                        CONCAT62(local_4a8._18_6_,local_4a8._16_2_) + 1);
                      }
                      if (local_4d0 != (undefined1  [8])&local_4c0) {
                        operator_delete((void *)local_4d0,
                                        (ulong)(local_4c0._M_allocated_capacity + 1));
                      }
                      if (err != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        plVar16 = (long *)::std::__cxx11::string::_M_append
                                                    (local_4d0,(ulong)(err->_M_dataplus)._M_p);
                        pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(plVar16 + 2);
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            *plVar16 == pbVar1) {
                          pcVar3 = (pbVar1->_M_dataplus)._M_p;
                          local_4a8._16_2_ = SUB82(pcVar3,0);
                          local_4a8._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
                          local_4a8._24_2_ = (undefined2)plVar16[3];
                          local_4a8._26_6_ = (undefined6)((ulong)plVar16[3] >> 0x10);
                          local_4a8._0_8_ =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_4a8 + 0x10);
                        }
                        else {
                          pcVar3 = (pbVar1->_M_dataplus)._M_p;
                          local_4a8._16_2_ = SUB82(pcVar3,0);
                          local_4a8._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
                          local_4a8._0_8_ =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               *plVar16;
                        }
                        local_4a8._8_2_ = (undefined2)plVar16[1];
                        local_4a8._10_6_ = (undefined6)((ulong)plVar16[1] >> 0x10);
                        *plVar16 = (long)pbVar1;
                        plVar16[1] = 0;
                        *(undefined1 *)(plVar16 + 2) = 0;
                        ::std::__cxx11::string::operator=((string *)err,(string *)local_4a8);
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_4a8._0_8_ !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_4a8 + 0x10)) {
                          operator_delete((void *)local_4a8._0_8_,
                                          CONCAT62(local_4a8._18_6_,local_4a8._16_2_) + 1);
                        }
                        if (local_4d0 != (undefined1  [8])&local_4c0) {
                          operator_delete((void *)local_4d0,
                                          (ulong)(local_4c0._M_allocated_capacity + 1));
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b8);
                      ::std::ios_base::~ios_base(local_248);
                      iVar14 = 1;
                      goto LAB_00226f8f;
                    }
                  }
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_460._M_p != &bStack_450) {
                    operator_delete(local_460._M_p,(long)bStack_450._M_dataplus._M_p + 1);
                  }
                  if (bVar11) {
                    local_d0[0] = local_c0;
                    lVar24 = *(long *)&(pPVar19->_attrib)._variability;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)local_d0,lVar24,
                               (pPVar19->_attrib)._type_name._M_dataplus._M_p + lVar24);
                    local_2b8 = (undefined1  [8])(local_2b0 + 8);
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_2b8,"velocities","");
                    pPVar25 = (Property *)local_2b8;
                    (anonymous_namespace)::
                    ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                              ((ParseResult *)local_468,(_anonymous_namespace_ *)&local_400,
                               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_d0,(string *)local_420,(Property *)local_2b8,local_310,
                               (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                                *)CONCAT44(in_stack_fffffffffffffb2c,uVar13));
                    if (local_2b8 != (undefined1  [8])(local_2b0 + 8)) {
                      operator_delete((void *)local_2b8,
                                      (ulong)(aStack_2a8._M_allocated_capacity + 1));
                    }
                    if (local_d0[0] != local_c0) {
                      operator_delete(local_d0[0],local_c0[0] + 1);
                    }
                    iVar14 = 0;
                    if (((ulong)local_468 & 0xfffffffd) == 0) {
                      iVar14 = 3;
LAB_0022728d:
                      bVar11 = false;
                    }
                    else {
                      bVar11 = true;
                      if (local_468._0_4_ != Unmatched) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2b8,"[error]",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2b8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   ,0x5a);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2b8,":",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2b8,"ReconstructPrim",0xf);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2b8,"():",3);
                        poVar15 = (ostream *)::std::ostream::operator<<((Property *)local_2b8,0xf5a)
                        ;
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                        local_4d0 = (undefined1  [8])&local_4c0;
                        ::std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_4d0,"Parsing attribute `{}` failed. Error: {}",""
                                  );
                        fmt::format<char[11],std::__cxx11::string>
                                  ((string *)local_4a8,(fmt *)local_4d0,(string *)"velocities",
                                   (char (*) [11])&local_460,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)pPVar25);
                        poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_2b8,(char *)local_4a8._0_8_,
                                             CONCAT62(local_4a8._10_6_,local_4a8._8_2_));
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_4a8._0_8_ !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_4a8 + 0x10)) {
                          operator_delete((void *)local_4a8._0_8_,
                                          CONCAT62(local_4a8._18_6_,local_4a8._16_2_) + 1);
                        }
                        if (local_4d0 != (undefined1  [8])&local_4c0) {
                          operator_delete((void *)local_4d0,
                                          (ulong)(local_4c0._M_allocated_capacity + 1));
                        }
                        if (err != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)0x0) {
                          ::std::__cxx11::stringbuf::str();
                          plVar16 = (long *)::std::__cxx11::string::_M_append
                                                      (local_4d0,(ulong)(err->_M_dataplus)._M_p);
                          pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(plVar16 + 2);
                          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              *plVar16 == pbVar1) {
                            pcVar3 = (pbVar1->_M_dataplus)._M_p;
                            local_4a8._16_2_ = SUB82(pcVar3,0);
                            local_4a8._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
                            local_4a8._24_2_ = (undefined2)plVar16[3];
                            local_4a8._26_6_ = (undefined6)((ulong)plVar16[3] >> 0x10);
                            local_4a8._0_8_ =
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_4a8 + 0x10);
                          }
                          else {
                            pcVar3 = (pbVar1->_M_dataplus)._M_p;
                            local_4a8._16_2_ = SUB82(pcVar3,0);
                            local_4a8._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
                            local_4a8._0_8_ =
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)*plVar16;
                          }
                          local_4a8._8_2_ = (undefined2)plVar16[1];
                          local_4a8._10_6_ = (undefined6)((ulong)plVar16[1] >> 0x10);
                          *plVar16 = (long)pbVar1;
                          plVar16[1] = 0;
                          *(undefined1 *)(plVar16 + 2) = 0;
                          ::std::__cxx11::string::operator=((string *)err,(string *)local_4a8);
                          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_4a8._0_8_ !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_4a8 + 0x10)) {
                            operator_delete((void *)local_4a8._0_8_,
                                            CONCAT62(local_4a8._18_6_,local_4a8._16_2_) + 1);
                          }
                          if (local_4d0 != (undefined1  [8])&local_4c0) {
                            operator_delete((void *)local_4d0,
                                            (ulong)(local_4c0._M_allocated_capacity + 1));
                          }
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b8);
                        ::std::ios_base::~ios_base(local_248);
                        iVar14 = 1;
                        goto LAB_0022728d;
                      }
                    }
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_460._M_p != &bStack_450) {
                      operator_delete(local_460._M_p,(long)bStack_450._M_dataplus._M_p + 1);
                    }
                    if (bVar11) {
                      local_100._16_8_ = local_e0;
                      lVar24 = *(long *)&(pPVar19->_attrib)._variability;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)(local_100 + 0x10),lVar24,
                                 (pPVar19->_attrib)._type_name._M_dataplus._M_p + lVar24);
                      local_2b8 = (undefined1  [8])(local_2b0 + 8);
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_2b8,"accelerations","");
                      pPVar25 = (Property *)local_2b8;
                      (anonymous_namespace)::
                      ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                                ((ParseResult *)local_468,(_anonymous_namespace_ *)&local_400,
                                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)(local_100 + 0x10),(string *)local_420,(Property *)local_2b8,
                                 local_318,
                                 (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffb2c,uVar13));
                      if (local_2b8 != (undefined1  [8])(local_2b0 + 8)) {
                        operator_delete((void *)local_2b8,
                                        (ulong)(aStack_2a8._M_allocated_capacity + 1));
                      }
                      if ((undefined8 *)local_100._16_8_ != local_e0) {
                        operator_delete((void *)local_100._16_8_,local_e0[0] + 1);
                      }
                      iVar14 = 0;
                      if (((ulong)local_468 & 0xfffffffd) == 0) {
                        iVar14 = 3;
LAB_0022754f:
                        bVar11 = false;
                      }
                      else {
                        bVar11 = true;
                        if (local_468._0_4_ != Unmatched) {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2b8,"[error]",7);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2b8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     ,0x5a);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2b8,":",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2b8,"ReconstructPrim",0xf);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2b8,"():",3);
                          poVar15 = (ostream *)
                                    ::std::ostream::operator<<((Property *)local_2b8,0xf5b);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                          local_4d0 = (undefined1  [8])&local_4c0;
                          ::std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_4d0,"Parsing attribute `{}` failed. Error: {}",
                                     "");
                          fmt::format<char[14],std::__cxx11::string>
                                    ((string *)local_4a8,(fmt *)local_4d0,(string *)"accelerations",
                                     (char (*) [14])&local_460,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)pPVar25);
                          poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_2b8,(char *)local_4a8._0_8_,
                                               CONCAT62(local_4a8._10_6_,local_4a8._8_2_));
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
                          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_4a8._0_8_ !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_4a8 + 0x10)) {
                            operator_delete((void *)local_4a8._0_8_,
                                            CONCAT62(local_4a8._18_6_,local_4a8._16_2_) + 1);
                          }
                          if (local_4d0 != (undefined1  [8])&local_4c0) {
                            operator_delete((void *)local_4d0,
                                            (ulong)(local_4c0._M_allocated_capacity + 1));
                          }
                          if (err != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)0x0) {
                            ::std::__cxx11::stringbuf::str();
                            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_4a8,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_4d0,err);
                            ::std::__cxx11::string::operator=((string *)err,(string *)local_4a8);
                            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_4a8._0_8_ !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(local_4a8 + 0x10)) {
                              operator_delete((void *)local_4a8._0_8_,
                                              CONCAT62(local_4a8._18_6_,local_4a8._16_2_) + 1);
                            }
                            if (local_4d0 != (undefined1  [8])&local_4c0) {
                              operator_delete((void *)local_4d0,
                                              (ulong)(local_4c0._M_allocated_capacity + 1));
                            }
                          }
                          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b8);
                          ::std::ios_base::~ios_base(local_248);
                          iVar14 = 1;
                          goto LAB_0022754f;
                        }
                      }
                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_460._M_p != &bStack_450) {
                        operator_delete(local_460._M_p,(long)bStack_450._M_dataplus._M_p + 1);
                      }
                      if (bVar11) {
                        local_110._0_8_ = local_100;
                        lVar24 = *(long *)&(pPVar19->_attrib)._variability;
                        ::std::__cxx11::string::_M_construct<char*>
                                  (local_110,lVar24,
                                   (pPVar19->_attrib)._type_name._M_dataplus._M_p + lVar24);
                        local_2b8 = (undefined1  [8])(local_2b0 + 8);
                        ::std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_2b8,"angularVelocities","");
                        pPVar25 = (Property *)local_2b8;
                        (anonymous_namespace)::
                        ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                                  ((ParseResult *)local_468,(_anonymous_namespace_ *)&local_400,
                                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_110,(string *)local_420,(Property *)local_2b8,local_320,
                                   (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                                    *)CONCAT44(in_stack_fffffffffffffb2c,uVar13));
                        if (local_2b8 != (undefined1  [8])(local_2b0 + 8)) {
                          operator_delete((void *)local_2b8,
                                          (ulong)(aStack_2a8._M_allocated_capacity + 1));
                        }
                        if ((undefined1 *)local_110._0_8_ != local_100) {
                          operator_delete((void *)local_110._0_8_,local_100._0_8_ + 1);
                        }
                        iVar14 = 0;
                        if (((ulong)local_468 & 0xfffffffd) == 0) {
                          iVar14 = 3;
LAB_00227811:
                          bVar11 = false;
                        }
                        else {
                          bVar11 = true;
                          if (local_468._0_4_ != Unmatched) {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8)
                            ;
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2b8,"[error]",7);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2b8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                       ,0x5a);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2b8,":",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2b8,"ReconstructPrim",0xf);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2b8,"():",3);
                            poVar15 = (ostream *)
                                      ::std::ostream::operator<<((Property *)local_2b8,0xf5c);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                            local_4d0 = (undefined1  [8])&local_4c0;
                            ::std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_4d0,
                                       "Parsing attribute `{}` failed. Error: {}","");
                            fmt::format<char[18],std::__cxx11::string>
                                      ((string *)local_4a8,(fmt *)local_4d0,
                                       (string *)"angularVelocities",(char (*) [18])&local_460,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)pPVar25);
                            poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)local_2b8,(char *)local_4a8._0_8_,
                                                 CONCAT62(local_4a8._10_6_,local_4a8._8_2_));
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
                            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_4a8._0_8_ !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(local_4a8 + 0x10)) {
                              operator_delete((void *)local_4a8._0_8_,
                                              CONCAT62(local_4a8._18_6_,local_4a8._16_2_) + 1);
                            }
                            if (local_4d0 != (undefined1  [8])&local_4c0) {
                              operator_delete((void *)local_4d0,
                                              (ulong)(local_4c0._M_allocated_capacity + 1));
                            }
                            if (err != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)0x0) {
                              ::std::__cxx11::stringbuf::str();
                              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_4a8,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_4d0,err);
                              ::std::__cxx11::string::operator=((string *)err,(string *)local_4a8);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_4a8._0_8_ !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(local_4a8 + 0x10)) {
                                operator_delete((void *)local_4a8._0_8_,
                                                CONCAT62(local_4a8._18_6_,local_4a8._16_2_) + 1);
                              }
                              if (local_4d0 != (undefined1  [8])&local_4c0) {
                                operator_delete((void *)local_4d0,
                                                (ulong)(local_4c0._M_allocated_capacity + 1));
                              }
                            }
                            ::std::__cxx11::ostringstream::~ostringstream
                                      ((ostringstream *)local_2b8);
                            ::std::ios_base::~ios_base(local_248);
                            iVar14 = 1;
                            goto LAB_00227811;
                          }
                        }
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_460._M_p != &bStack_450) {
                          operator_delete(local_460._M_p,(long)bStack_450._M_dataplus._M_p + 1);
                        }
                        if (bVar11) {
                          local_130[0] = local_120;
                          lVar24 = *(long *)&(pPVar19->_attrib)._variability;
                          ::std::__cxx11::string::_M_construct<char*>
                                    ((string *)local_130,lVar24,
                                     (pPVar19->_attrib)._type_name._M_dataplus._M_p + lVar24);
                          local_2b8 = (undefined1  [8])(local_2b0 + 8);
                          ::std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_2b8,"invisibleIds","");
                          pPVar25 = (Property *)local_2b8;
                          (anonymous_namespace)::
                          ParseTypedAttribute<std::vector<long,std::allocator<long>>>
                                    ((ParseResult *)local_468,(_anonymous_namespace_ *)&local_400,
                                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_130,(string *)local_420,(Property *)local_2b8,
                                     local_330,
                                     (TypedAttribute<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_>
                                      *)CONCAT44(in_stack_fffffffffffffb2c,uVar13));
                          if (local_2b8 != (undefined1  [8])(local_2b0 + 8)) {
                            operator_delete((void *)local_2b8,
                                            (ulong)(aStack_2a8._M_allocated_capacity + 1));
                          }
                          if (local_130[0] != local_120) {
                            operator_delete(local_130[0],local_120[0] + 1);
                          }
                          iVar14 = 0;
                          if (((ulong)local_468 & 0xfffffffd) == 0) {
                            iVar14 = 3;
LAB_00227ad3:
                            bVar11 = false;
                          }
                          else {
                            bVar11 = true;
                            if (local_468._0_4_ != Unmatched) {
                              ::std::__cxx11::ostringstream::ostringstream
                                        ((ostringstream *)local_2b8);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2b8,"[error]",7);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2b8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                         ,0x5a);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2b8,":",1);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2b8,"ReconstructPrim",0xf);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2b8,"():",3);
                              poVar15 = (ostream *)
                                        ::std::ostream::operator<<((Property *)local_2b8,0xf5d);
                              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                              local_4d0 = (undefined1  [8])&local_4c0;
                              ::std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_4d0,
                                         "Parsing attribute `{}` failed. Error: {}","");
                              fmt::format<char[13],std::__cxx11::string>
                                        ((string *)local_4a8,(fmt *)local_4d0,
                                         (string *)"invisibleIds",(char (*) [13])&local_460,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)pPVar25);
                              poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_2b8,(char *)local_4a8._0_8_,
                                                   CONCAT62(local_4a8._10_6_,local_4a8._8_2_));
                              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_4a8._0_8_ !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(local_4a8 + 0x10)) {
                                operator_delete((void *)local_4a8._0_8_,
                                                CONCAT62(local_4a8._18_6_,local_4a8._16_2_) + 1);
                              }
                              if (local_4d0 != (undefined1  [8])&local_4c0) {
                                operator_delete((void *)local_4d0,
                                                (ulong)(local_4c0._M_allocated_capacity + 1));
                              }
                              if (err != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0) {
                                ::std::__cxx11::stringbuf::str();
                                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_4a8,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_4d0,err);
                                ::std::__cxx11::string::operator=((string *)err,(string *)local_4a8)
                                ;
                                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_4a8._0_8_ !=
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(local_4a8 + 0x10)) {
                                  operator_delete((void *)local_4a8._0_8_,
                                                  CONCAT62(local_4a8._18_6_,local_4a8._16_2_) + 1);
                                }
                                if (local_4d0 != (undefined1  [8])&local_4c0) {
                                  operator_delete((void *)local_4d0,
                                                  (ulong)(local_4c0._M_allocated_capacity + 1));
                                }
                              }
                              ::std::__cxx11::ostringstream::~ostringstream
                                        ((ostringstream *)local_2b8);
                              ::std::ios_base::~ios_base(local_248);
                              iVar14 = 1;
                              goto LAB_00227ad3;
                            }
                          }
                          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_460._M_p != &bStack_450) {
                            operator_delete(local_460._M_p,(long)bStack_450._M_dataplus._M_p + 1);
                          }
                          __k = local_408;
                          if (bVar11) {
                            cVar18 = ::std::
                                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&local_400,local_408);
                            p_Var2 = &local_400._M_t._M_impl.super__Rb_tree_header;
                            if ((_Rb_tree_header *)cVar18._M_node == p_Var2) {
                              this_00 = ::std::
                                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                        ::operator[](local_338,__k);
                              Property::operator=(this_00,local_420);
                              ::std::
                              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              ::_M_insert_unique<std::__cxx11::string_const&>
                                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                          *)&local_400,__k);
                            }
                            cVar18 = ::std::
                                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&local_400,__k);
                            pPVar25 = local_410;
                            if ((_Rb_tree_header *)cVar18._M_node == p_Var2) {
                              ::std::__cxx11::ostringstream::ostringstream
                                        ((ostringstream *)local_2b8);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2b8,"[error]",7);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2b8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                         ,0x5a);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2b8,":",1);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2b8,"ReconstructPrim",0xf);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2b8,"():",3);
                              poVar15 = (ostream *)
                                        ::std::ostream::operator<<((ostringstream *)local_2b8,0xf60)
                              ;
                              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_468,"Unsupported/unimplemented property: ",
                                               local_408);
                              poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_2b8,(char *)local_468,
                                                   (long)local_460._M_p);
                              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
                              if (local_468 != (undefined1  [8])auStack_458) {
                                operator_delete((void *)local_468,(ulong)((long)auStack_458 + 1));
                              }
                              if (err != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0) {
                                ::std::__cxx11::stringbuf::str();
                                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_468,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_4a8,err);
                                ::std::__cxx11::string::operator=((string *)err,(string *)local_468)
                                ;
                                if (local_468 != (undefined1  [8])auStack_458) {
                                  operator_delete((void *)local_468,(ulong)((long)auStack_458 + 1));
                                }
                                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_4a8._0_8_ !=
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(local_4a8 + 0x10)) goto LAB_00227dbb;
                              }
                              goto LAB_00227dc8;
                            }
                            goto LAB_00227b89;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          pPVar25 = local_410;
          if ((iVar14 != 3) && (iVar14 != 0)) {
LAB_00227de9:
            bVar21 = false;
            goto LAB_00227deb;
          }
        }
LAB_00227b89:
        pPVar19 = (Property *)::std::_Rb_tree_increment((_Rb_tree_node_base *)pPVar19);
      } while (pPVar19 != pPVar25);
      bVar21 = true;
    }
  }
LAB_00227deb:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_400,
             (_Link_type)local_400._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar21;
}

Assistant:

bool ReconstructPrim<PointInstancer>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    PointInstancer *instancer,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)warn;
  (void)references;
  (void)options;

  DCOUT("Reconstruct PointInstancer.");

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, instancer, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_TARGET_PATHS_RELATION(table, prop, "prototypes", instancer->prototypes)
    PARSE_TYPED_ATTRIBUTE(table, prop, "protoIndices", PointInstancer, instancer->protoIndices)
    PARSE_TYPED_ATTRIBUTE(table, prop, "ids", PointInstancer, instancer->ids)
    PARSE_TYPED_ATTRIBUTE(table, prop, "positions", PointInstancer, instancer->positions)
    PARSE_TYPED_ATTRIBUTE(table, prop, "orientations", PointInstancer, instancer->orientations)
    PARSE_TYPED_ATTRIBUTE(table, prop, "scales", PointInstancer, instancer->scales)
    PARSE_TYPED_ATTRIBUTE(table, prop, "velocities", PointInstancer, instancer->velocities)
    PARSE_TYPED_ATTRIBUTE(table, prop, "accelerations", PointInstancer, instancer->accelerations)
    PARSE_TYPED_ATTRIBUTE(table, prop, "angularVelocities", PointInstancer, instancer->angularVelocities)
    PARSE_TYPED_ATTRIBUTE(table, prop, "invisibleIds", PointInstancer, instancer->invisibleIds)

    ADD_PROPERTY(table, prop, PointInstancer, instancer->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

  return true;
}